

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu2.c
# Opt level: O2

MPP_RET hal_vp8d_vdpu2_start(void *hal,HalTaskInfo *task)

{
  void *pvVar1;
  uint uVar2;
  MPP_RET MVar3;
  MPP_RET MVar4;
  FILE *pFVar5;
  void *pvVar6;
  size_t sVar7;
  char *fmt;
  VP8DHalContext_t *ctx;
  ulong uVar8;
  MppDevRegRdCfg rd_cfg;
  char name [256];
  
  pvVar1 = *(void **)((long)hal + 0x18);
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x286,
               "hal_vp8d_vdpu2_start");
  }
  if ((hal_vp8d_debug & 4) != 0) {
    hal_vp8d_vdpu2_dump_info_frame_cnt = hal_vp8d_vdpu2_dump_info_frame_cnt + 1;
    sprintf(name,"/data/video/reg_%d.bin");
    pFVar5 = fopen(name,"ab+");
    if (pFVar5 != (FILE *)0x0) {
      for (uVar8 = 0; uVar8 != 0x9f; uVar8 = uVar8 + 1) {
        fprintf(pFVar5,"reg[%d] %#08x\n",uVar8 & 0xffffffff);
      }
      fclose(pFVar5);
    }
    sprintf(name,"/data/video/seg_map_%d.bin",(ulong)hal_vp8d_vdpu2_dump_info_frame_cnt);
    pFVar5 = fopen(name,"ab+");
    if (pFVar5 != (FILE *)0x0) {
      pvVar6 = mpp_buffer_get_ptr_with_caller
                         (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu2_dump_info");
      uVar2 = 0;
      while( true ) {
        sVar7 = mpp_buffer_get_size_with_caller
                          (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu2_dump_info");
        if (sVar7 >> 2 <= (ulong)uVar2) break;
        fprintf(pFVar5,"%#08x\n",(ulong)*(uint *)((long)pvVar6 + (ulong)uVar2 * 4));
        uVar2 = uVar2 + 1;
      }
      fclose(pFVar5);
    }
    sprintf(name,"/data/video/probe_%d.bin",(ulong)hal_vp8d_vdpu2_dump_info_frame_cnt);
    pFVar5 = fopen(name,"ab+");
    if (pFVar5 != (FILE *)0x0) {
      pvVar6 = mpp_buffer_get_ptr_with_caller
                         (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu2_dump_info");
      uVar2 = 0;
      while( true ) {
        sVar7 = mpp_buffer_get_size_with_caller
                          (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu2_dump_info");
        if (sVar7 >> 2 <= (ulong)uVar2) break;
        fprintf(pFVar5,"%#08x\n",(ulong)*(uint *)((long)pvVar6 + (ulong)uVar2 * 4));
        uVar2 = uVar2 + 1;
      }
      fclose(pFVar5);
    }
  }
  name[8] = '|';
  name[9] = '\x02';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name._0_8_ = pvVar1;
  MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,name);
  if (MVar3 == MPP_OK) {
    rd_cfg.size = 0x27c;
    rd_cfg.offset = 0;
    rd_cfg.reg = pvVar1;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),5,&rd_cfg);
    if (MVar3 == MPP_OK) {
      MVar4 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0xf,(void *)0x0);
      MVar3 = MPP_OK;
      if (MVar4 != MPP_OK) {
        _mpp_log_l(2,"hal_vp8d_vdpu2","send cmd failed %d\n","hal_vp8d_vdpu2_start",
                   (ulong)(uint)MVar4);
        MVar3 = MVar4;
      }
      goto LAB_001f5275;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_vp8d_vdpu2",fmt,"hal_vp8d_vdpu2_start",(ulong)(uint)MVar3);
LAB_001f5275:
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x2aa,
               "hal_vp8d_vdpu2_start");
  }
  return MVar3;
}

Assistant:

MPP_RET hal_vp8d_vdpu2_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;
    VP8DRegSet_t *regs = (VP8DRegSet_t *)ctx->regs;

    FUN_T("FUN_IN");
    if (hal_vp8d_debug & VP8H_DBG_DUMP_REG)
        hal_vp8d_vdpu2_dump_info(hal, task);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = sizeof(VP8DRegSet_t);

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    FUN_T("FUN_OUT");

    (void)task;
    return ret;
}